

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_spawns.cxx
# Opt level: O0

void __thiscall xray_re::xr_spawn_object::save_v12(xr_spawn_object *this,xr_ini_writer *w)

{
  pointer *this_00;
  xr_ini_packet *this_01;
  string *psVar1;
  xr_scene *this_02;
  size_t in_RCX;
  xr_ini_packet *__n;
  size_t __n_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  allocator<xray_re::xr_custom_object_*> local_71;
  undefined1 local_70 [8];
  xr_custom_object_vec objects;
  xr_packet *packet;
  xr_ini_packet *ini_packet;
  xr_ini_writer *w_local;
  xr_spawn_object *this_local;
  
  xr_custom_object::save_v12(&this->super_xr_custom_object,w);
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    xr_ini_writer::write(w,0x2e3b0c,(void *)0x1,in_RCX);
  }
  xr_ini_writer::write
            (w,0x2e38e3,(void *)(ulong)*(uint *)&(this->super_xr_custom_object).field_0x6c,in_RCX);
  xr_ini_writer::write(w,0x2e4e39,(void *)0x17,in_RCX);
  if (*(int *)&(this->super_xr_custom_object).field_0x6c == 2) {
    if ((this->field_1).m_entity == (cse_abstract *)0x0) {
      __assert_fail("m_entity",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xa1,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    xr_ini_writer::open_section(w,"spawndata");
    this_01 = (xr_ini_packet *)operator_new(0x11a8);
    xr_ini_packet::xr_ini_packet(this_01);
    __n = this_01;
    cse_abstract::spawn_write((this->field_1).m_entity,(xr_packet *)this_01,true);
    xr_ini_writer::write_packet(w,this_01);
    xr_ini_writer::write(w,0x2e3b6c,(void *)0x0,(size_t)__n);
    psVar1 = cse_abstract::name_abi_cxx11_((this->field_1).m_entity);
    this_00 = &objects.
               super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)this_00,(string *)psVar1);
    xr_ini_writer::write(w,0x2e1396,this_00,0);
    std::__cxx11::string::~string
              ((string *)
               &objects.
                super__Vector_base<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    xr_ini_writer::close_section(w);
    if (this_01 != (xr_ini_packet *)0x0) {
      operator_delete(this_01,0x1018);
    }
  }
  else if (*(int *)&(this->super_xr_custom_object).field_0x6c == 0) {
    xr_ini_writer::write(w,0x2e2527,(void *)(ulong)(this->field_1).field_0.m_game,in_RCX);
    __n_00 = 0;
    xr_ini_writer::write(w,0x2e3b6f,"",0);
    xr_ini_writer::write(w,0x2e3b7a,(void *)(ulong)(this->field_1).field_0.m_respawn,__n_00);
    xr_ini_writer::write(w,0x2e3b82,(void *)(ulong)(this->field_1).field_0.m_team,__n_00);
  }
  else {
    if (*(int *)&(this->super_xr_custom_object).field_0x6c != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_spawns.cxx"
                    ,0xc6,"virtual void xray_re::xr_spawn_object::save_v12(xr_ini_writer *) const");
    }
    xr_ini_writer::write(w,0x2e3b8a,(void *)(ulong)(this->field_1).field_1.m_ambient_color,in_RCX);
    xr_ini_writer::write(w,0x2e3b98,(void *)0xffff,in_RCX);
    xr_ini_writer::write(w,0x2e3ba1,__buf,in_RCX);
    xr_ini_writer::write(w,0x2e3baa,__buf_00,in_RCX);
    xr_ini_writer::write(w,0x2e3bb4,(void *)(ulong)(this->field_1).field_1.m_fog_color,in_RCX);
    xr_ini_writer::write(w,0x2e3bbe,__buf_01,in_RCX);
    xr_ini_writer::write(w,0x2e3bca,(void *)(ulong)(this->field_1).field_1.m_hemi_color,in_RCX);
    xr_ini_writer::write(w,0x2e3bd5,(void *)(ulong)(this->field_1).field_1.m_sky_color,in_RCX);
    xr_ini_writer::write(w,0x2e3bdf,__buf_02,in_RCX);
  }
  if (this->m_attached_object != (xr_custom_object *)0x0) {
    std::allocator<xray_re::xr_custom_object_*>::allocator(&local_71);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::vector
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_70,1,&this->m_attached_object,&local_71);
    std::allocator<xray_re::xr_custom_object_*>::~allocator(&local_71);
    this_02 = xr_custom_object::scene(&this->super_xr_custom_object);
    xr_scene::save_objects
              (this_02,w,
               (vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_70,"attached");
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::~vector
              ((vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_> *)
               local_70);
  }
  return;
}

Assistant:

void xr_spawn_object::save_v12(xr_ini_writer* w) const
{
	xr_custom_object::save_v12(w);

	if (this->m_attached_object)
		w->write("attached_count", 1);

	w->write("type", this->m_type);
	w->write("version", SPAWNPOINT_VERSION_V12);

	if (m_type == SPAWNPOINT_TYPE_ENTITY) {
		xr_assert(m_entity);

		w->open_section("spawndata");
		
		xr_ini_packet *ini_packet = new xr_ini_packet();
		xr_packet* packet = ini_packet;
		m_entity->spawn_write(*packet, true);
		//w->w_packet(*ini_packet);
		w->write_packet(ini_packet);

		w->write("fl", 0);
		w->write("name", this->m_entity->name(), false);
		w->close_section();

		delete packet;
	}
	else if (m_type == SPAWNPOINT_TYPE_RPOINT)
	{
		w->write("game_type", m_game);
		w->write("rp_profile", "", false);
		w->write("rp_type", m_respawn);
		w->write("team_id", m_team);
	} 
	else if (m_type == SPAWNPOINT_TYPE_ENV_MOD)
	{
		w->write("ambient_color", m_ambient_color);
		w->write("em_flags", 65535); // apparently em_flags don't exist in current code
		w->write("em_power", m_power);
		w->write("em_radius", m_radius);
		w->write("fog_color", m_fog_color);
		w->write("fog_density", m_fog_density);
		w->write("hemi_color", m_hemi_color);
		w->write("sky_color", m_sky_color);
		w->write("view_dist", m_view_distance);
	}
	else
	{
		xr_not_expected();
	}
	
	if (this->m_attached_object)
	{
		xr_custom_object_vec objects(1, m_attached_object);
		scene().save_objects(w, objects, "attached");
	}
}